

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O1

HRESULT ExecuteTest(char *fileName)

{
  bool bVar1;
  int iVar2;
  HRESULT HVar3;
  JsErrorCode JVar4;
  HRESULT HVar5;
  size_t sVar6;
  PAL_FILE *pPVar7;
  LPCWSTR pWVar8;
  Debugger *this;
  char *pcVar9;
  size_t fileLength;
  size_t extraout_RDX;
  char16_t *pcVar10;
  char *pcVar11;
  uint *fileContents_00;
  JsContextRef local_158;
  char fullPath [260];
  uint local_4c;
  uint *puStack_48;
  uint rcount;
  LPCSTR fileContents;
  JsRuntimeHandle pvStack_38;
  UINT lengthBytes;
  JsRuntimeHandle runtime;
  
  puStack_48 = (uint *)0x0;
  pvStack_38 = (JsRuntimeHandle)0x0;
  fileContents._4_4_ = 0;
  sVar6 = strlen(fileName);
  if ((sVar6 < 0xe) || (iVar2 = strcmp(fileName + (sVar6 - 0xe),"ttdSentinal.js"), iVar2 != 0)) {
    pcVar11 = fileName;
    HVar3 = Helpers::LoadScriptFromFile
                      (fileName,(LPCSTR *)&stack0xffffffffffffffb8,(UINT *)((long)&fileContents + 4)
                       ,(string *)0x0,false);
    HVar5 = HVar3;
    if (HVar3 < 0) goto LAB_0010946d;
    if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled == true) {
      jsrtAttributes = jsrtAttributes | 0x8000000;
    }
    if (doTTRecord == 0) {
      if (doTTReplay != 0) {
        ExecuteTest();
        HVar5 = ExecuteTest(pcVar11);
        if (HVar5 < 0) {
          PAL_exit(0);
        }
        PAL__flushall();
        if ((ChakraRTInterface::m_testHooks.pfSetEnableCheckMemoryLeakOutput !=
             (SetEnableCheckMemoryLeakOutputPtr)0x0 & ChakraRTInterface::m_testHooksSetup) == 1) {
          (*ChakraRTInterface::m_testHooks.pfSetEnableCheckMemoryLeakOutput)(true);
        }
        return HVar5;
      }
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateRuntime)
                        (jsrtAttributes,(JsThreadServiceCallback)0x0,&stack0xffffffffffffffc8);
      if (JVar4 == JsNoError) {
        chRuntime = pvStack_38;
        if (HostConfigFlags::flags.DebugLaunch == true) {
          this = Debugger::GetDebugger(pvStack_38);
          Debugger::StartDebugging(this,pvStack_38);
        }
        local_158 = (JsContextRef)0x0;
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(pvStack_38,&local_158);
        if (JVar4 == JsNoError) {
          JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
          if (JVar4 == JsNoError) {
            bVar1 = false;
          }
          else {
            pPVar7 = PAL_get_stderr(0);
            pWVar8 = Helpers::JsErrorCodeToString(JVar4);
            PAL_fwprintf(pPVar7,
                         L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar4,pWVar8);
            pPVar7 = PAL_get_stderr(0);
            PAL_fflush(pPVar7);
            bVar1 = true;
          }
        }
        else {
          pPVar7 = PAL_get_stderr(0);
          pWVar8 = Helpers::JsErrorCodeToString(JVar4);
          PAL_fwprintf(pPVar7,
                       L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar4,pWVar8);
          pPVar7 = PAL_get_stderr(0);
          PAL_fflush(pPVar7);
          bVar1 = true;
        }
        goto joined_r0x00109841;
      }
      pPVar7 = PAL_get_stderr(0);
      pWVar8 = Helpers::JsErrorCodeToString(JVar4);
      pcVar10 = 
      L"ERROR: ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    else {
      jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateRecordRuntime)
                        (jsrtAttributes,false,(ulong)snapInterval,(ulong)snapHistoryLength,
                         Helpers::TTCreateStreamCallback,Helpers::TTWriteBytesToStreamCallback,
                         Helpers::TTFlushAndCloseStreamCallback,(JsThreadServiceCallback)0x0,
                         &stack0xffffffffffffffc8);
      if (JVar4 == JsNoError) {
        chRuntime = pvStack_38;
        local_158 = (JsContextRef)0x0;
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateContext)
                          (pvStack_38,true,&local_158);
        if (JVar4 == JsNoError) {
          JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
          if (JVar4 == JsNoError) {
            bVar1 = false;
            JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback)
                              (local_158,(void *)0x0,WScriptJsrt::JsContextBeforeCollectCallback);
            if (JVar4 != JsNoError) {
              pPVar7 = PAL_get_stderr(0);
              pWVar8 = Helpers::JsErrorCodeToString(JVar4);
              PAL_fwprintf(pPVar7,
                           L"ERROR: ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback) failed. JsErrorCode=0x%x (%s)\n"
                           ,(ulong)JVar4,pWVar8);
              pPVar7 = PAL_get_stderr(0);
              PAL_fflush(pPVar7);
              bVar1 = true;
            }
          }
          else {
            pPVar7 = PAL_get_stderr(0);
            pWVar8 = Helpers::JsErrorCodeToString(JVar4);
            PAL_fwprintf(pPVar7,
                         L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar4,pWVar8);
            pPVar7 = PAL_get_stderr(0);
            PAL_fflush(pPVar7);
            bVar1 = true;
          }
        }
        else {
          pPVar7 = PAL_get_stderr(0);
          pWVar8 = Helpers::JsErrorCodeToString(JVar4);
          PAL_fwprintf(pPVar7,
                       L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar4,pWVar8);
          pPVar7 = PAL_get_stderr(0);
          PAL_fflush(pPVar7);
          bVar1 = true;
        }
joined_r0x00109841:
        if (bVar1) goto LAB_0010946d;
        if ((ChakraRTInterface::m_testHooks.pfSetCheckOpHelpersFlag != (_func_HRESULT_bool *)0x0 &
            ChakraRTInterface::m_testHooksSetup) == 1) {
          (*ChakraRTInterface::m_testHooks.pfSetCheckOpHelpersFlag)(true);
        }
        bVar1 = WScriptJsrt::Initialize();
        HVar5 = -0x7fffbffb;
        if ((!bVar1) ||
           (pcVar11 = fileName, pcVar9 = _fullpath((char *)&local_158,fileName,0x104),
           pcVar9 == (char *)0x0)) goto LAB_0010946d;
        if (HostConfigFlags::flags.TrackRejectedPromises == true) {
          pcVar11 = (char *)0x0;
          (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker)
                    (WScriptJsrt::PromiseRejectionTrackerCallback,(void *)0x0);
        }
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled == true) {
          HVar5 = CreateLibraryByteCode((char *)puStack_48);
          goto LAB_0010946d;
        }
        if (HostConfigFlags::flags.SerializedIsEnabled == true) {
          CreateAndRunSerializedScript
                    (fileName,(LPCSTR)puStack_48,(ulong)fileContents._4_4_,WScriptJsrt::FinalizeFree
                     ,(char *)&local_158);
          HVar5 = HVar3;
          goto LAB_0010946d;
        }
        if (HostConfigFlags::flags.GenerateParserStateCacheIsEnabled == true) {
          CreateParserState((LPCSTR)puStack_48,(size_t)pcVar11,WScriptJsrt::FinalizeFree,
                            (LPCWSTR)0x0);
          HVar5 = HVar3;
          goto LAB_0010946d;
        }
        fileLength = (size_t)fileContents._4_4_;
        fileContents_00 = puStack_48;
        if (HostConfigFlags::flags.UseParserStateCacheIsEnabled == true) {
          CreateParserStateAndRunScript
                    (fileName,(LPCSTR)puStack_48,fileLength,WScriptJsrt::FinalizeFree,
                     (char *)&local_158);
          HVar5 = HVar3;
          goto LAB_0010946d;
        }
        goto LAB_001099d7;
      }
      pPVar7 = PAL_get_stderr(0);
      pWVar8 = Helpers::JsErrorCodeToString(JVar4);
      pcVar10 = 
      L"ERROR: ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar7,pcVar10,(ulong)JVar4,pWVar8);
    pPVar7 = PAL_get_stderr(0);
    PAL_fflush(pPVar7);
  }
  else {
    if (doTTReplay == 0) {
      PAL_wprintf(L"Sentinel js file is only ok when in TTReplay mode!!!\n");
      return -0x7fffbffb;
    }
    jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
    HVar5 = 0;
    JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateReplayRuntime)
                      (jsrtAttributes,ttUri,ttUriLength,false,Helpers::TTCreateStreamCallback,
                       Helpers::TTReadBytesFromStreamCallback,Helpers::TTFlushAndCloseStreamCallback
                       ,(JsThreadServiceCallback)0x0,&stack0xffffffffffffffc8);
    if (JVar4 == JsNoError) {
      chRuntime = pvStack_38;
      local_158 = (JsContextRef)0x0;
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtTTDCreateContext)(pvStack_38,true,&local_158);
      if (JVar4 == JsNoError) {
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(local_158);
        if (JVar4 == JsNoError) {
          HVar5 = RunScript(fileName,(LPCSTR)puStack_48,(ulong)fileContents._4_4_,
                            WScriptJsrt::FinalizeFree,(JsValueRef)0x0,(char *)0x0,(JsValueRef)0x0);
          if (HVar5 < 0) goto LAB_0010946d;
          local_4c = 0;
          JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
          if (JVar4 != JsNoError) {
            pPVar7 = PAL_get_stderr(0);
            pWVar8 = Helpers::JsErrorCodeToString(JVar4);
            pcVar10 = 
            L"ERROR: ChakraRTInterface::JsSetCurrentContext(nullptr) failed. JsErrorCode=0x%x (%s)\n"
            ;
            goto LAB_00109819;
          }
          fileContents_00 = &local_4c;
          (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(local_158,fileContents_00);
          if (local_4c == 0) goto LAB_0010946d;
          ExecuteTest();
          fileLength = extraout_RDX;
LAB_001099d7:
          HVar5 = RunScript(fileName,(LPCSTR)fileContents_00,fileLength,WScriptJsrt::FinalizeFree,
                            (JsValueRef)0x0,(char *)&local_158,(JsValueRef)0x0);
          goto LAB_0010946d;
        }
        HVar5 = 0;
        pPVar7 = PAL_get_stderr(0);
        pWVar8 = Helpers::JsErrorCodeToString(JVar4);
        pcVar10 = 
        L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
      }
      else {
        HVar5 = 0;
        pPVar7 = PAL_get_stderr(0);
        pWVar8 = Helpers::JsErrorCodeToString(JVar4);
        pcVar10 = 
        L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      pPVar7 = PAL_get_stderr(0);
      pWVar8 = Helpers::JsErrorCodeToString(JVar4);
      pcVar10 = 
      L"ERROR: ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
LAB_00109819:
    PAL_fwprintf(pPVar7,pcVar10,(ulong)JVar4,pWVar8);
    pPVar7 = PAL_get_stderr(0);
    PAL_fflush(pPVar7);
  }
LAB_0010946d:
  if (Debugger::debugger != (Debugger *)0x0) {
    Debugger::CompareOrWriteBaselineFile(Debugger::debugger,fileName);
    Debugger::CloseDebugger();
  }
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
  if (pvStack_38 != (JsRuntimeHandle)0x0) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(pvStack_38);
  }
  PAL__flushall();
  return HVar5;
}

Assistant:

HRESULT ExecuteTest(const char* fileName)
{
    HRESULT hr = S_OK;
    LPCSTR fileContents = nullptr;
    JsRuntimeHandle runtime = JS_INVALID_RUNTIME_HANDLE;
    UINT lengthBytes = 0;

    if(strlen(fileName) >= 14 && strcmp(fileName + strlen(fileName) - 14, "ttdSentinal.js") == 0)
    {
#if !ENABLE_TTD
        wprintf(_u("Sentinel js file is only ok when in TTDebug mode!!!\n"));
        return E_FAIL;
#else
        if(!doTTReplay)
        {
            wprintf(_u("Sentinel js file is only ok when in TTReplay mode!!!\n"));
            return E_FAIL;
        }

        jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
        chRuntime = runtime;

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

        IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, nullptr, nullptr));

        unsigned int rcount = 0;
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(nullptr));
        ChakraRTInterface::JsRelease(context, &rcount);
        AssertMsg(rcount == 0, "Should only have had 1 ref from replay code and one ref from current context??");
#endif
    }
    else
    {
        LPCOLESTR contentsRaw = nullptr;

        char fullPath[_MAX_PATH];
        size_t len = 0;

        hr = Helpers::LoadScriptFromFile(fileName, fileContents, &lengthBytes);
        contentsRaw; lengthBytes; // Unused for now.

        IfFailGo(hr);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            jsrtAttributes = (JsRuntimeAttributes)(jsrtAttributes | JsRuntimeAttributeSerializeLibraryByteCode);
        }

#if ENABLE_TTD
        if (doTTRecord)
        {
            //Ensure we run with experimental features (as that is what Node does right now).
            jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
            chRuntime = runtime;

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

#if ENABLE_TTD
            //We need this here since this context is created in record
            IfJsErrorFailLog(ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback));
#endif
        }
        else
        {
            AssertMsg(!doTTReplay, "Should be handled in the else case above!!!");

            IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
            chRuntime = runtime;

            if (HostConfigFlags::flags.DebugLaunch)
            {
                Debugger* debugger = Debugger::GetDebugger(runtime);
                debugger->StartDebugging(runtime);
            }

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));

            //Don't need collect callback since this is always in replay

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
        }
#else
        IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
        chRuntime = runtime;

        if (HostConfigFlags::flags.DebugLaunch)
        {
            Debugger* debugger = Debugger::GetDebugger(runtime);
            debugger->StartDebugging(runtime);
        }

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
#endif

#ifdef DEBUG
        ChakraRTInterface::SetCheckOpHelpersFlag(true);
#endif

        if (!WScriptJsrt::Initialize())
        {
            IfFailGo(E_FAIL);
        }

        if (_fullpath(fullPath, fileName, _MAX_PATH) == nullptr)
        {
            IfFailGo(E_FAIL);
        }

        if (HostConfigFlags::flags.TrackRejectedPromises)
        {
            ChakraRTInterface::JsSetHostPromiseRejectionTracker(WScriptJsrt::PromiseRejectionTrackerCallback, nullptr);
        }
        
        len = strlen(fullPath);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            IfFailGo(CreateLibraryByteCode(fileContents));
        }
        else if (HostConfigFlags::flags.SerializedIsEnabled)
        {
            CreateAndRunSerializedScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else if (HostConfigFlags::flags.GenerateParserStateCacheIsEnabled)
        {
            CreateParserState(fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr);
        }
        else if (HostConfigFlags::flags.UseParserStateCacheIsEnabled)
        {
            CreateParserStateAndRunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else
        {
            IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, fullPath, nullptr));
        }
    }
Error:
    if (Debugger::debugger != nullptr)
    {
        Debugger::debugger->CompareOrWriteBaselineFile(fileName);
        Debugger::CloseDebugger();
    }

    ChakraRTInterface::JsSetCurrentContext(nullptr);

    if (runtime != JS_INVALID_RUNTIME_HANDLE)
    {
        ChakraRTInterface::JsDisposeRuntime(runtime);
    }

    _flushall();

    return hr;
}